

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O0

void zzMulMod(word *c,word *a,word *b,word *mod,size_t n,void *stack)

{
  void *in_RDX;
  size_t in_RSI;
  word *in_RDI;
  word *prod;
  
  zzMul((word *)n,(word *)stack,(size_t)prod,in_RDI,in_RSI,in_RDX);
  zzMod(c,a,(size_t)b,mod,n,stack);
  return;
}

Assistant:

void zzMulMod(word c[], const word a[], const word b[], const word mod[],
	size_t n, void* stack)
{
	word* prod = (word*)stack;
	stack = prod + 2 * n;
	ASSERT(wwCmp(a, mod, n) < 0);
	ASSERT(wwCmp(b, mod, n) < 0);
	ASSERT(wwIsValid(c, n));
	ASSERT(n > 0 && mod[n - 1] != 0);
	zzMul(prod, a, n, b, n, stack);
	zzMod(c, prod, 2 * n, mod, n, stack);
}